

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  PrimRef *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  size_t sVar11;
  size_t *psVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  size_t local_60;
  undefined1 auVar19 [64];
  undefined1 auVar21 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar15 = r->_begin;
  auVar20._8_4_ = 0x7f800000;
  auVar20._0_8_ = 0x7f8000007f800000;
  auVar20._12_4_ = 0x7f800000;
  auVar21 = ZEXT1664(auVar20);
  auVar18._8_4_ = 0xff800000;
  auVar18._0_8_ = 0xff800000ff800000;
  auVar18._12_4_ = 0xff800000;
  auVar19 = ZEXT1664(auVar18);
  local_60 = 0;
  auVar22._8_4_ = 0xddccb9a2;
  auVar22._0_8_ = 0xddccb9a2ddccb9a2;
  auVar22._12_4_ = 0xddccb9a2;
  auVar23._8_4_ = 0x5dccb9a2;
  auVar23._0_8_ = 0x5dccb9a25dccb9a2;
  auVar23._12_4_ = 0x5dccb9a2;
  auVar24 = ZEXT1664(auVar18);
  auVar25 = ZEXT1664(auVar20);
LAB_01c4d02f:
  if (r->_end <= uVar15) {
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = auVar25._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar24._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar21._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar19._0_16_;
    __return_storage_ptr__->end = local_60;
    return __return_storage_ptr__;
  }
  pBVar2 = (this->super_LineSegments).vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   *(long *)&(this->super_LineSegments).field_0x68 * uVar15);
  uVar16 = (ulong)uVar1;
  uVar13 = (ulong)(uVar1 + 1);
  if (uVar13 < (pBVar2->super_RawBufferView).num) {
    psVar12 = &pBVar2[itime].super_RawBufferView.stride;
    uVar10 = itime - 1;
    do {
      uVar10 = uVar10 + 1;
      if (itime < uVar10) {
        psVar12 = &pBVar2[itime + 1].super_RawBufferView.stride;
        sVar11 = itime;
        goto LAB_01c4d0f6;
      }
      auVar18 = *(undefined1 (*) [16])
                 (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar16);
      uVar8 = vcmpps_avx512vl(auVar18,auVar22,6);
      uVar9 = vcmpps_avx512vl(auVar18,auVar23,1);
      if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
      auVar20 = *(undefined1 (*) [16])
                 (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar13);
      uVar8 = vcmpps_avx512vl(auVar20,auVar22,6);
      uVar9 = vcmpps_avx512vl(auVar20,auVar23,1);
      if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
      psVar12 = psVar12 + 7;
      auVar18 = vshufps_avx(auVar18,auVar18,0xff);
      auVar20 = vshufps_avx(auVar20,auVar20,0xff);
      auVar18 = vminss_avx(auVar18,auVar20);
    } while (0.0 <= auVar18._0_4_);
  }
  goto LAB_01c4d213;
  while( true ) {
    auVar18 = *(undefined1 (*) [16])(((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar16)
    ;
    uVar8 = vcmpps_avx512vl(auVar18,auVar22,6);
    uVar9 = vcmpps_avx512vl(auVar18,auVar23,1);
    if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
    auVar20 = *(undefined1 (*) [16])(((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar13)
    ;
    uVar8 = vcmpps_avx512vl(auVar20,auVar22,6);
    uVar9 = vcmpps_avx512vl(auVar20,auVar23,1);
    if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) break;
    psVar12 = psVar12 + 7;
    auVar18 = vshufps_avx(auVar18,auVar18,0xff);
    auVar20 = vshufps_avx(auVar20,auVar20,0xff);
    auVar18 = vminss_avx(auVar18,auVar20);
    if (auVar18._0_4_ < 0.0) break;
LAB_01c4d0f6:
    sVar11 = sVar11 + 1;
    if (itime + 1 < sVar11) {
      pcVar3 = pBVar2[itime].super_RawBufferView.ptr_ofs;
      sVar11 = pBVar2[itime].super_RawBufferView.stride;
      lVar17 = uVar16 * sVar11;
      lVar14 = uVar13 * sVar11;
      auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar17),
                           *(undefined1 (*) [16])(pcVar3 + lVar14));
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar17),
                           *(undefined1 (*) [16])(pcVar3 + lVar14));
      auVar20 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar14 + 0xc)),
                           ZEXT416(*(uint *)(pcVar3 + lVar17 + 0xc)));
      fVar7 = auVar20._0_4_ * (this->super_LineSegments).maxRadiusScale;
      auVar27._4_4_ = fVar7;
      auVar27._0_4_ = fVar7;
      auVar27._8_4_ = fVar7;
      auVar27._12_4_ = fVar7;
      auVar20 = vsubps_avx(auVar26,auVar27);
      aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar20,ZEXT416(geomID),0x30);
      auVar26._0_4_ = auVar18._0_4_ + fVar7;
      auVar26._4_4_ = auVar18._4_4_ + fVar7;
      auVar26._8_4_ = auVar18._8_4_ + fVar7;
      auVar26._12_4_ = auVar18._12_4_ + fVar7;
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar26,ZEXT416((uint)uVar15),0x30);
      auVar18 = vminps_avx((undefined1  [16])auVar25._0_16_,(undefined1  [16])aVar5);
      auVar25 = ZEXT1664(auVar18);
      auVar18 = vmaxps_avx((undefined1  [16])auVar24._0_16_,(undefined1  [16])aVar6);
      auVar24 = ZEXT1664(auVar18);
      auVar28._0_4_ = aVar5.x + aVar6.x;
      auVar28._4_4_ = aVar5.y + aVar6.y;
      auVar28._8_4_ = aVar5.z + aVar6.z;
      auVar28._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
      auVar18 = vminps_avx((undefined1  [16])auVar21._0_16_,auVar28);
      auVar21 = ZEXT1664(auVar18);
      auVar18 = vmaxps_avx((undefined1  [16])auVar19._0_16_,auVar28);
      auVar19 = ZEXT1664(auVar18);
      local_60 = local_60 + 1;
      pPVar4 = prims->items;
      pPVar4[k].upper.field_0.field_1 = aVar6;
      pPVar4[k].lower.field_0.field_1 = aVar5;
      k = k + 1;
      break;
    }
  }
LAB_01c4d213:
  uVar15 = uVar15 + 1;
  goto LAB_01c4d02f;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }